

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O3

Privkey * __thiscall
cfd::api::KeyApi::GetPrivkey
          (Privkey *__return_storage_ptr__,KeyApi *this,string *privkey,NetType *net_type,
          bool *is_compressed)

{
  pointer puVar1;
  bool bVar2;
  bool is_compress;
  NetType temp_net_type;
  bool local_4d;
  NetType local_4c;
  Privkey local_48;
  
  core::Privkey::Privkey(__return_storage_ptr__);
  local_4d = true;
  local_4c = kMainnet;
  bVar2 = core::Privkey::HasWif(privkey,&local_4c,&local_4d);
  if (bVar2) {
    core::Privkey::FromWif(&local_48,privkey,local_4c,local_4d);
    puVar1 = (__return_storage_ptr__->data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 == (pointer)0x0) {
      __return_storage_ptr__->is_compressed_ = local_48.is_compressed_;
      *(undefined3 *)&__return_storage_ptr__->field_0x19 = local_48._25_3_;
      __return_storage_ptr__->net_type_ = local_48.net_type_;
    }
    else {
      operator_delete(puVar1);
      __return_storage_ptr__->is_compressed_ = local_48.is_compressed_;
      *(undefined3 *)&__return_storage_ptr__->field_0x19 = local_48._25_3_;
      __return_storage_ptr__->net_type_ = local_48.net_type_;
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (net_type != (NetType *)0x0) {
      *net_type = local_4c;
    }
    if (is_compressed != (bool *)0x0) {
      *is_compressed = local_4d;
    }
  }
  else {
    core::Privkey::Privkey(&local_48,privkey,kMainnet,true);
    puVar1 = (__return_storage_ptr__->data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 == (pointer)0x0) {
      __return_storage_ptr__->is_compressed_ = local_48.is_compressed_;
      *(undefined3 *)&__return_storage_ptr__->field_0x19 = local_48._25_3_;
      __return_storage_ptr__->net_type_ = local_48.net_type_;
    }
    else {
      operator_delete(puVar1);
      __return_storage_ptr__->is_compressed_ = local_48.is_compressed_;
      *(undefined3 *)&__return_storage_ptr__->field_0x19 = local_48._25_3_;
      __return_storage_ptr__->net_type_ = local_48.net_type_;
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey KeyApi::GetPrivkey(
    const std::string& privkey, NetType* net_type, bool* is_compressed) const {
  Privkey key;
  bool is_compress = true;
  NetType temp_net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(privkey, &temp_net_type, &is_compress);
  if (has_wif) {
    key = Privkey::FromWif(privkey, temp_net_type, is_compress);
    if (net_type != nullptr) *net_type = temp_net_type;
    if (is_compressed != nullptr) *is_compressed = is_compress;
  } else {
    key = Privkey(privkey);
  }
  return key;
}